

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O2

void UpdateW(fixed_y_t *src,fixed_y_t *dst,int w)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = 0;
  if (0 < w) {
    uVar2 = (ulong)(uint)w;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = LinearToGammaS((int)(kGammaToLinearTabS[src[(long)(w * 2) + uVar3]] * 0x127c +
                                 kGammaToLinearTabS[src[(long)w + uVar3]] * 0xb717 +
                                 kGammaToLinearTabS[src[uVar3]] * 0x366d + 0x8000) >> 0x10);
    dst[uVar3] = (fixed_y_t)uVar1;
  }
  return;
}

Assistant:

static WEBP_INLINE void UpdateW(const fixed_y_t* src, fixed_y_t* dst, int w) {
  int i;
  for (i = 0; i < w; ++i) {
    const uint32_t R = GammaToLinearS(src[0 * w + i]);
    const uint32_t G = GammaToLinearS(src[1 * w + i]);
    const uint32_t B = GammaToLinearS(src[2 * w + i]);
    const uint32_t Y = RGBToGray(R, G, B);
    dst[i] = (fixed_y_t)LinearToGammaS(Y);
  }
}